

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O0

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddSign
          (ElementsTransactionApi *this,string *hex,Txid *txid,uint32_t vout,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
          bool is_witness,bool clear_stack)

{
  _func_ConfidentialTransactionController_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_RCX;
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDX;
  ConfidentialTransactionController *in_RDI;
  undefined1 in_stack_00000346;
  undefined1 in_stack_00000347;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_00000348;
  uint32_t in_stack_00000354;
  Txid *in_stack_00000358;
  string *in_stack_00000360;
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_00000368;
  
  std::function<cfd::ConfidentialTransactionController(std::__cxx11::string_const&)>::
  function<cfd::ConfidentialTransactionController(&)(std::__cxx11::string_const&),void>
            (in_RDX,in_RCX);
  TransactionApiBase::AddSign<cfd::ConfidentialTransactionController>
            (in_stack_00000368,in_stack_00000360,in_stack_00000358,in_stack_00000354,
             in_stack_00000348,(bool)in_stack_00000347,(bool)in_stack_00000346);
  std::
  function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<cfd::ConfidentialTransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x41db1f);
  return in_RDI;
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddSign(
    const std::string& hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_params, bool is_witness,
    bool clear_stack) const {
  return TransactionApiBase::AddSign<ConfidentialTransactionController>(
      cfd::api::CreateController, hex, txid, vout, sign_params, is_witness,
      clear_stack);
}